

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

void Cbs_ManDeriveReason(Cbs_Man_t *p,int Level)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  void **ppvVar6;
  Gia_Obj_t **ppGVar7;
  uint uVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  lVar11 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar11] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x250,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  uVar12 = lVar11 + 1;
  iVar10 = (int)uVar12;
  if ((p->pClauses).iTail <= iVar10) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x251,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  if (iVar10 < (p->pClauses).iTail) {
    uVar13 = uVar12 & 0xffffffff;
    do {
      pGVar2 = (p->pClauses).pData[uVar12];
      if (((uint)*(ulong *)pGVar2 >> 0x1e & 1) != 0) {
        *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff;
        pVVar9 = p->vTemp;
        uVar8 = pVVar9->nCap;
        if (pVVar9->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar9->pArray,0x80);
            }
            pVVar9->pArray = ppvVar6;
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar8 * 2;
            if (iVar10 <= (int)uVar8) goto LAB_00666d10;
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar9->pArray,(ulong)uVar8 << 4);
            }
            pVVar9->pArray = ppvVar6;
          }
          pVVar9->nCap = iVar10;
        }
LAB_00666d10:
        iVar10 = pVVar9->nSize;
        pVVar9->nSize = iVar10 + 1;
        pVVar9->pArray[iVar10] = pGVar2;
        uVar8 = pGVar2->Value;
        if (uVar8 == 0xffffffff) {
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                        ,99,"int Cbs_VarDecLevel(Cbs_Man_t *, Gia_Obj_t *)");
        }
        uVar4 = uVar8 * 3;
        if ((int)uVar4 < 0) {
LAB_00666eea:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = p->vLevReas->nSize;
        if (uVar1 == uVar4 || SBORROW4(uVar1,uVar4) != (int)(uVar1 + uVar8 * -3) < 0)
        goto LAB_00666eea;
        piVar3 = p->vLevReas->pArray;
        iVar10 = piVar3[uVar4];
        if (iVar10 < Level) {
          ppGVar7 = (p->pClauses).pData;
          lVar11 = (long)(int)uVar13;
          uVar13 = (ulong)((int)uVar13 + 1);
        }
        else {
          if (iVar10 != Level) {
            __assert_fail("iLitLevel == Level",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                          ,0x26a,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
          }
          uVar4 = uVar4 + 1;
          if (((int)uVar4 < 0) || ((int)uVar1 <= (int)uVar4)) goto LAB_00666eea;
          lVar11 = (long)piVar3[uVar4];
          if (lVar11 != 0) {
            iVar10 = (p->pClauses).nSize;
            if ((p->pClauses).iTail == iVar10) {
              (p->pClauses).nSize = iVar10 * 2;
              ppGVar7 = (p->pClauses).pData;
              if (ppGVar7 == (Gia_Obj_t **)0x0) {
                ppGVar7 = (Gia_Obj_t **)malloc((long)iVar10 << 4);
              }
              else {
                ppGVar7 = (Gia_Obj_t **)realloc(ppGVar7,(long)iVar10 << 4);
              }
              (p->pClauses).pData = ppGVar7;
            }
            iVar10 = (p->pClauses).iTail;
            iVar5 = iVar10 + 1;
            (p->pClauses).iTail = iVar5;
            (p->pClauses).pData[iVar10] = pGVar2 + lVar11;
            if (pGVar2->Value == 0xffffffff) {
              __assert_fail("pVar->Value != ~0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                            ,0x65,"Gia_Obj_t *Cbs_VarReason1(Cbs_Man_t *, Gia_Obj_t *)");
            }
            uVar8 = pGVar2->Value * 3 + 2;
            if (((int)uVar8 < 0) || (p->vLevReas->nSize <= (int)uVar8)) goto LAB_00666eea;
            lVar11 = (long)p->vLevReas->pArray[uVar8];
            if (lVar11 != 0) {
              iVar10 = (p->pClauses).nSize;
              if (iVar5 == iVar10) {
                (p->pClauses).nSize = iVar10 * 2;
                ppGVar7 = (p->pClauses).pData;
                if (ppGVar7 == (Gia_Obj_t **)0x0) {
                  ppGVar7 = (Gia_Obj_t **)malloc((long)iVar10 << 4);
                }
                else {
                  ppGVar7 = (Gia_Obj_t **)realloc(ppGVar7,(long)iVar10 << 4);
                }
                (p->pClauses).pData = ppGVar7;
              }
              iVar10 = (p->pClauses).iTail;
              (p->pClauses).iTail = iVar10 + 1;
              (p->pClauses).pData[iVar10] = pGVar2 + lVar11;
            }
            goto LAB_00666e7e;
          }
          ppGVar7 = (p->pClauses).pData;
          lVar11 = (long)(p->pClauses).iHead;
          if (ppGVar7[lVar11] != (Gia_Obj_t *)0x0) {
            __assert_fail("pQue->pData[pQue->iHead] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                          ,0x26e,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
          }
        }
        ppGVar7[lVar11] = pGVar2;
      }
LAB_00666e7e:
      iVar10 = (int)uVar13;
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(p->pClauses).iTail);
  }
  if ((p->pClauses).pData[(p->pClauses).iHead] == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x277,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  (p->pClauses).iTail = iVar10;
  pVVar9 = p->vTemp;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      *(ulong *)pVVar9->pArray[lVar11] = *pVVar9->pArray[lVar11] | 0x40000000;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vTemp;
    } while (lVar11 < pVVar9->nSize);
  }
  return;
}

Assistant:

static inline void Cbs_ManDeriveReason( Cbs_Man_t * p, int Level )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, iLitLevel;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fMark0 == 1 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Vec_PtrPush( p->vTemp, pObj );
        // check decision level
        iLitLevel = Cbs_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs_VarReason0( p, pObj );
        if ( pReason == pObj ) // no reason
        {
            assert( pQue->pData[pQue->iHead] == NULL );
            pQue->pData[pQue->iHead] = pObj;
            continue;
        }
        Cbs_QuePush( pQue, pReason );
        pReason = Cbs_VarReason1( p, pObj );
        if ( pReason != pObj ) // second reason
            Cbs_QuePush( pQue, pReason );
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fMark0 = 1;
}